

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint generateFixedDistanceTree(HuffmanTree *tree)

{
  uint *puVar1;
  uint uVar2;
  uint *bitlen;
  long lVar3;
  
  bitlen = (uint *)malloc(0x80);
  if (bitlen == (uint *)0x0) {
    uVar2 = 0x53;
  }
  else {
    lVar3 = 0;
    do {
      puVar1 = bitlen + lVar3;
      *puVar1 = 5;
      puVar1[1] = 5;
      puVar1[2] = 5;
      puVar1[3] = 5;
      puVar1[4] = 5;
      puVar1[5] = 5;
      puVar1[6] = 5;
      puVar1[7] = 5;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    uVar2 = HuffmanTree_makeFromLengths(tree,bitlen,0x20,0xf);
    free(bitlen);
  }
  return uVar2;
}

Assistant:

static unsigned generateFixedDistanceTree(HuffmanTree* tree) {
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DISTANCE_SYMBOLS * sizeof(unsigned));
  if (!bitlen) return 83; /*alloc fail*/

  /*there are 32 distance codes, but 30-31 are unused*/
  for (i = 0; i != NUM_DISTANCE_SYMBOLS; ++i) bitlen[i] = 5;
  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DISTANCE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}